

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecimalDatatypeValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DecimalDatatypeValidator::setEnumeration
          (DecimalDatatypeValidator *this,MemoryManager *manager)

{
  BaseRefVectorOf<xercesc_4_0::XMLNumber> *this_00;
  XMLSize_t maxElems;
  DatatypeValidator *pDVar1;
  char16_t *pcVar2;
  RefVectorOf<xercesc_4_0::XMLNumber> *this_01;
  XMLBigDecimal *this_02;
  XMLException *anon_var_0;
  DecimalDatatypeValidator *numBase;
  XMLSize_t enumLength;
  XMLSize_t i;
  MemoryManager *manager_local;
  DecimalDatatypeValidator *this_local;
  
  if ((this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.fStrEnumeration !=
      (RefArrayVectorOf<char16_t> *)0x0) {
    maxElems = BaseRefVectorOf<char16_t>::size
                         (&((this->super_AbstractNumericValidator).
                            super_AbstractNumericFacetValidator.fStrEnumeration)->
                           super_BaseRefVectorOf<char16_t>);
    pDVar1 = DatatypeValidator::getBaseValidator((DatatypeValidator *)this);
    if (pDVar1 != (DatatypeValidator *)0x0) {
      for (enumLength = 0; enumLength < maxElems; enumLength = enumLength + 1) {
        pcVar2 = BaseRefVectorOf<char16_t>::elementAt
                           (&((this->super_AbstractNumericValidator).
                              super_AbstractNumericFacetValidator.fStrEnumeration)->
                             super_BaseRefVectorOf<char16_t>,enumLength);
        (*(pDVar1->super_XSerializable)._vptr_XSerializable[0x11])(pDVar1,pcVar2,0,0,manager);
      }
    }
    this_01 = (RefVectorOf<xercesc_4_0::XMLNumber> *)XMemory::operator_new(0x30,manager);
    RefVectorOf<xercesc_4_0::XMLNumber>::RefVectorOf(this_01,maxElems,true,manager);
    (this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.fEnumeration =
         this_01;
    (this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.fEnumerationInherited
         = false;
    for (enumLength = 0; enumLength < maxElems; enumLength = enumLength + 1) {
      this_00 = &((this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
                 fEnumeration)->super_BaseRefVectorOf<xercesc_4_0::XMLNumber>;
      this_02 = (XMLBigDecimal *)XMemory::operator_new(0x38,manager);
      pcVar2 = BaseRefVectorOf<char16_t>::elementAt
                         (&((this->super_AbstractNumericValidator).
                            super_AbstractNumericFacetValidator.fStrEnumeration)->
                           super_BaseRefVectorOf<char16_t>,enumLength);
      XMLBigDecimal::XMLBigDecimal(this_02,pcVar2,manager);
      BaseRefVectorOf<xercesc_4_0::XMLNumber>::insertElementAt
                (this_00,(XMLNumber *)this_02,enumLength);
    }
  }
  return;
}

Assistant:

void DecimalDatatypeValidator::setEnumeration(MemoryManager* const manager)
{
    // check 4.3.5.c0 must: enumeration values from the value space of base
    //
    // 1. shall be from base value space
    // 2. shall be from current value space as well ( shall go through boundsCheck() )
    //
    if (!fStrEnumeration)
        return;

    XMLSize_t i = 0;
    XMLSize_t enumLength = fStrEnumeration->size();

    DecimalDatatypeValidator *numBase = (DecimalDatatypeValidator*) getBaseValidator();
    if (numBase)
    {
        try
        {
            for ( i = 0; i < enumLength; i++)
            {
                numBase->checkContent(fStrEnumeration->elementAt(i), (ValidationContext*)0, false, manager);
            }
        }
        catch (XMLException&)
        {
            ThrowXMLwithMemMgr1(InvalidDatatypeFacetException
                    , XMLExcepts::FACET_enum_base
                    , fStrEnumeration->elementAt(i)
                    , manager);
        }
    }
#if 0
// spec says that only base has to checkContent
    // We put the this->checkContent in a separate loop
    // to not block original message with in that method.
    //
    for ( i = 0; i < enumLength; i++)
    {
        checkContent(fStrEnumeration->elementAt(i), (ValidationContext*)0, false, manager);
    }
#endif
    fEnumeration = new (manager) RefVectorOf<XMLNumber>(enumLength, true, manager);
    fEnumerationInherited = false;

    for ( i = 0; i < enumLength; i++)
    {
        fEnumeration->insertElementAt(new (manager) XMLBigDecimal(fStrEnumeration->elementAt(i), manager), i);
    }

}